

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ostream * slang::operator<<(ostream *os,ConstantValue *cv)

{
  ostream *poVar1;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ConstantValue *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this = &local_30;
  ConstantValue::toString_abi_cxx11_
            (in_stack_ffffffffffffffb8,(bitwidth_t)((ulong)this >> 0x20),
             SUB81((ulong)this >> 0x18,0),SUB81((ulong)this >> 0x10,0));
  poVar1 = std::operator<<(in_RDI,(string *)this);
  std::__cxx11::string::~string(this);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ConstantValue& cv) {
    return os << cv.toString();
}